

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

GEN_DATA * new_gen_data(void)

{
  GEN_DATA *__s;
  
  if (gen_data_free == (GEN_DATA *)0x0) {
    __s = (GEN_DATA *)operator_new(0x360);
  }
  else {
    __s = gen_data_free;
    gen_data_free = gen_data_free->next;
  }
  memset(__s,0,0x360);
  __s->valid = true;
  return __s;
}

Assistant:

GEN_DATA *new_gen_data(void)
{
	static GEN_DATA gen_zero;
	GEN_DATA *gen;

	if (gen_data_free == nullptr)
	{
		gen = new GEN_DATA;
	}
	else
	{
		gen = gen_data_free;
		gen_data_free = gen_data_free->next;
	}

	*gen = gen_zero;

	gen->valid = true;
	return gen;
}